

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFilteringTests.cpp
# Opt level: O0

char * deqp::gles31::Functional::getFaceDesc(CubeFace face)

{
  char *pcStack_10;
  CubeFace face_local;
  
  switch(face) {
  case CUBEFACE_NEGATIVE_X:
    pcStack_10 = "-X";
    break;
  case CUBEFACE_POSITIVE_X:
    pcStack_10 = "+X";
    break;
  case CUBEFACE_NEGATIVE_Y:
    pcStack_10 = "-Y";
    break;
  case CUBEFACE_POSITIVE_Y:
    pcStack_10 = "+Y";
    break;
  case CUBEFACE_NEGATIVE_Z:
    pcStack_10 = "-Z";
    break;
  case CUBEFACE_POSITIVE_Z:
    pcStack_10 = "+Z";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char* getFaceDesc (const tcu::CubeFace face)
{
	switch (face)
	{
		case tcu::CUBEFACE_NEGATIVE_X:	return "-X";
		case tcu::CUBEFACE_POSITIVE_X:	return "+X";
		case tcu::CUBEFACE_NEGATIVE_Y:	return "-Y";
		case tcu::CUBEFACE_POSITIVE_Y:	return "+Y";
		case tcu::CUBEFACE_NEGATIVE_Z:	return "-Z";
		case tcu::CUBEFACE_POSITIVE_Z:	return "+Z";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}